

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::CreateMakeVariable
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *s,string *s2)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  long lVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  uint uVar6;
  string ret;
  string unmodified;
  char buffer_1 [5];
  char buffer [5];
  int local_a8;
  string str1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&unmodified,(string *)s);
  std::__cxx11::string::append((string *)&unmodified);
  if (this->MakefileVariableSize == 0) {
    lVar3 = std::__cxx11::string::find((char)&unmodified,0x2e);
    if ((lVar3 == -1) && (this->MakefileVariableSize == 0)) {
      lVar3 = std::__cxx11::string::find((char)&unmodified,0x2b);
      if ((lVar3 == -1) && (this->MakefileVariableSize == 0)) {
        lVar3 = std::__cxx11::string::find((char)&unmodified,0x2d);
        if (lVar3 == -1) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)unmodified._M_dataplus._M_p == &unmodified.field_2) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(unmodified.field_2._M_allocated_capacity._1_7_,
                          unmodified.field_2._M_local_buf[0]);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = unmodified.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = unmodified._M_dataplus._M_p;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(unmodified.field_2._M_allocated_capacity._1_7_,
                          unmodified.field_2._M_local_buf[0]);
          }
          __return_storage_ptr__->_M_string_length = unmodified._M_string_length;
          unmodified._M_string_length = 0;
          unmodified.field_2._M_local_buf[0] = '\0';
          unmodified._M_dataplus._M_p = (pointer)&unmodified.field_2;
          goto LAB_003d150c;
        }
      }
    }
  }
  this_00 = &this->MakeVariableMap;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&unmodified);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(iVar2._M_node + 2));
    goto LAB_003d150c;
  }
  std::__cxx11::string::string((string *)&ret,(string *)&unmodified);
  iVar1 = this->MakefileVariableSize;
  if (iVar1 == 0) {
    str1._M_dataplus._M_p._0_1_ = 0x2e;
    buffer[0] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ret._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(ret._M_dataplus._M_p + ret._M_string_length),(char *)&str1,buffer);
    cmsys::SystemTools::ReplaceString(&ret,"-","__");
    cmsys::SystemTools::ReplaceString(&ret,"+","___");
    uVar6 = 0;
    while( true ) {
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&this->ShortMakeVariableMap,&ret);
      if ((999 < uVar6) || (sVar4 == 0)) break;
      uVar6 = uVar6 + 1;
      sprintf(buffer,"%04d",(ulong)uVar6);
      std::operator+(&str1,&unmodified,buffer);
      std::__cxx11::string::operator=((string *)&ret,(string *)&str1);
      std::__cxx11::string::~string((string *)&str1);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->ShortMakeVariableMap,&ret);
    std::__cxx11::string::assign((char *)pmVar5);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&unmodified);
    std::__cxx11::string::_M_assign((string *)pmVar5);
LAB_003d14c3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p == &ret.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = ret._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = ret._M_string_length;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
  }
  else {
    if ((int)ret._M_string_length <= iVar1) {
LAB_003d14ab:
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&unmodified);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      goto LAB_003d14c3;
    }
    std::__cxx11::string::string((string *)&str1,(string *)s);
    std::__cxx11::string::string((string *)buffer,(string *)s2);
    if (iVar1 + -8 < local_a8) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)buffer);
      std::__cxx11::string::operator=((string *)buffer,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (iVar1 + -5 < local_a8 + (int)str1._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&str1);
      std::__cxx11::string::operator=((string *)&str1,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    sprintf(buffer_1,"%04d",0);
    std::operator+(&local_50,&str1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
    std::operator+(&local_70,&local_50,buffer_1);
    std::__cxx11::string::operator=((string *)&ret,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    uVar6 = 1;
    while( true ) {
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&this->ShortMakeVariableMap,&ret);
      if ((999 < uVar6 - 1) || (sVar4 == 0)) break;
      sprintf(buffer_1,"%04d",(ulong)uVar6);
      std::operator+(&local_50,&str1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
      std::operator+(&local_70,&local_50,buffer_1);
      std::__cxx11::string::operator=((string *)&ret,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      uVar6 = uVar6 + 1;
    }
    if (uVar6 == 0x3e9) {
      cmSystemTools::Error
                ("Borland makefile variable length too long",(char *)0x0,(char *)0x0,(char *)0x0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unmodified._M_dataplus._M_p == &unmodified.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(unmodified.field_2._M_allocated_capacity._1_7_,
                      unmodified.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = unmodified.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = unmodified._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(unmodified.field_2._M_allocated_capacity._1_7_,
                      unmodified.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = unmodified._M_string_length;
      unmodified._M_string_length = 0;
      unmodified.field_2._M_local_buf[0] = '\0';
      unmodified._M_dataplus._M_p = (pointer)&unmodified.field_2;
    }
    else {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ShortMakeVariableMap,&ret);
      std::__cxx11::string::assign((char *)pmVar5);
    }
    std::__cxx11::string::~string((string *)buffer);
    std::__cxx11::string::~string((string *)&str1);
    if (uVar6 != 0x3e9) goto LAB_003d14ab;
  }
  std::__cxx11::string::~string((string *)&ret);
LAB_003d150c:
  std::__cxx11::string::~string((string *)&unmodified);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::CreateMakeVariable(
  std::string const& s, std::string const& s2)
{
  std::string unmodified = s;
  unmodified += s2;
  // if there is no restriction on the length of make variables
  // and there are no "." characters in the string, then return the
  // unmodified combination.
  if ((!this->MakefileVariableSize &&
       unmodified.find('.') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('+') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('-') == std::string::npos)) {
    return unmodified;
  }

  // see if the variable has been defined before and return
  // the modified version of the variable
  std::map<std::string, std::string>::iterator i =
    this->MakeVariableMap.find(unmodified);
  if (i != this->MakeVariableMap.end()) {
    return i->second;
  }
  // start with the unmodified variable
  std::string ret = unmodified;
  // if this there is no value for this->MakefileVariableSize then
  // the string must have bad characters in it
  if (!this->MakefileVariableSize) {
    std::replace(ret.begin(), ret.end(), '.', '_');
    cmSystemTools::ReplaceString(ret, "-", "__");
    cmSystemTools::ReplaceString(ret, "+", "___");
    int ni = 0;
    char buffer[5];
    // make sure the _ version is not already used, if
    // it is used then add number to the end of the variable
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = unmodified + buffer;
    }
    this->ShortMakeVariableMap[ret] = "1";
    this->MakeVariableMap[unmodified] = ret;
    return ret;
  }

  // if the string is greater than 32 chars it is an invalid variable name
  // for borland make
  if (static_cast<int>(ret.size()) > this->MakefileVariableSize) {
    int keep = this->MakefileVariableSize - 8;
    int size = keep + 3;
    std::string str1 = s;
    std::string str2 = s2;
    // we must shorten the combined string by 4 characters
    // keep no more than 24 characters from the second string
    if (static_cast<int>(str2.size()) > keep) {
      str2 = str2.substr(0, keep);
    }
    if (static_cast<int>(str1.size()) + static_cast<int>(str2.size()) > size) {
      str1 = str1.substr(0, size - str2.size());
    }
    char buffer[5];
    int ni = 0;
    sprintf(buffer, "%04d", ni);
    ret = str1 + str2 + buffer;
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = str1 + str2 + buffer;
    }
    if (ni == 1000) {
      cmSystemTools::Error("Borland makefile variable length too long");
      return unmodified;
    }
    // once an unused variable is found
    this->ShortMakeVariableMap[ret] = "1";
  }
  // always make an entry into the unmodified to variable map
  this->MakeVariableMap[unmodified] = ret;
  return ret;
}